

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O1

void CS248::Collada::ColladaParser::parse_light(XMLElement *xml,LightInfo *light)

{
  int iVar1;
  char *pcVar2;
  XMLElement *pXVar3;
  XMLElement *pXVar4;
  char *pcVar5;
  XMLElement *pXVar6;
  XMLElement *pXVar7;
  XMLElement *pXVar8;
  XMLElement *extraout_RAX;
  XMLElement *extraout_RAX_00;
  _Alloc_hider _Var9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Spectrum SVar14;
  string color_string;
  string type;
  allocator local_281;
  undefined1 *local_280;
  long local_278;
  undefined1 local_270 [16];
  XMLElement *local_260;
  XMLElement *local_258;
  undefined1 *local_250 [2];
  undefined1 local_240 [16];
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  pcVar2 = tinyxml2::XMLElement::Attribute(xml,"id",(char *)0x0);
  pcVar5 = (char *)(light->super_Instance).id._M_string_length;
  strlen(pcVar2);
  std::__cxx11::string::_M_replace((ulong)&(light->super_Instance).id,0,pcVar5,(ulong)pcVar2);
  pcVar2 = tinyxml2::XMLElement::Attribute(xml,"name",(char *)0x0);
  pcVar5 = (char *)(light->super_Instance).name._M_string_length;
  strlen(pcVar2);
  std::__cxx11::string::_M_replace((ulong)&(light->super_Instance).name,0,pcVar5,(ulong)pcVar2);
  (light->super_Instance).type = LIGHT;
  pXVar3 = get_technique_common(xml);
  pXVar4 = get_technique_cmu462(xml);
  if (pXVar4 != (XMLElement *)0x0) {
    pXVar3 = pXVar4;
  }
  if (pXVar3 == (XMLElement *)0x0) goto LAB_00166e00;
  pXVar3 = tinyxml2::XMLNode::FirstChildElement(&pXVar3->super_XMLNode,(char *)0x0);
  if (pXVar3 == (XMLElement *)0x0) {
    return;
  }
  pcVar5 = tinyxml2::XMLNode::Value(&pXVar3->super_XMLNode);
  std::__cxx11::string::string((string *)local_250,pcVar5,(allocator *)&local_280);
  iVar1 = std::__cxx11::string::compare((char *)local_250);
  if (iVar1 == 0) {
    light->light_type = AMBIENT;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"color","");
    pXVar3 = get_element(pXVar3,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if (pXVar3 == (XMLElement *)0x0) goto LAB_00166e00;
    pcVar5 = tinyxml2::XMLElement::GetText(pXVar3);
    std::__cxx11::string::string((string *)&local_280,pcVar5,&local_281);
    paVar10 = &local_70.field_2;
    local_70._M_dataplus._M_p = (pointer)paVar10;
    std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_280,local_280 + local_278);
    SVar14 = spectrum_from_string(&local_70);
    light->spectrum = SVar14;
    _Var9._M_p = local_70._M_dataplus._M_p;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)local_250);
    if (iVar1 == 0) {
      light->light_type = DIRECTIONAL;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"color","");
      pXVar3 = get_element(pXVar3,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      if (pXVar3 == (XMLElement *)0x0) goto LAB_00166e00;
      pcVar5 = tinyxml2::XMLElement::GetText(pXVar3);
      std::__cxx11::string::string((string *)&local_280,pcVar5,&local_281);
      paVar10 = &local_b0.field_2;
      local_b0._M_dataplus._M_p = (pointer)paVar10;
      std::__cxx11::string::_M_construct<char*>((string *)&local_b0,local_280,local_280 + local_278)
      ;
      SVar14 = spectrum_from_string(&local_b0);
      light->spectrum = SVar14;
      _Var9._M_p = local_b0._M_dataplus._M_p;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)local_250);
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)local_250);
        if (iVar1 == 0) {
          light->light_type = POINT;
          local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"color","");
          pXVar4 = get_element(pXVar3,&local_110);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p != &local_110.field_2) {
            operator_delete(local_110._M_dataplus._M_p);
          }
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_130,"constant_attenuation","");
          pXVar6 = get_element(pXVar3,&local_130);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p);
          }
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_150,"linear_attenuation","");
          pXVar7 = get_element(pXVar3,&local_150);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p);
          }
          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_170,"quadratic_attenuation","");
          pXVar8 = get_element(pXVar3,&local_170);
          pXVar3 = pXVar8;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_170._M_dataplus._M_p != &local_170.field_2) {
            operator_delete(local_170._M_dataplus._M_p);
            pXVar3 = extraout_RAX_00;
          }
          auVar13._0_4_ = -(uint)((int)((ulong)pXVar4 >> 0x20) == 0 && (int)pXVar4 == 0);
          auVar13._4_4_ = -(uint)((int)pXVar6 == 0 && (int)((ulong)pXVar6 >> 0x20) == 0);
          auVar13._8_4_ = -(uint)((int)((ulong)pXVar7 >> 0x20) == 0 && (int)pXVar7 == 0);
          auVar13._12_4_ = -(uint)((int)pXVar8 == 0 && (int)((ulong)pXVar8 >> 0x20) == 0);
          iVar1 = movmskps((int)pXVar3,auVar13);
          if (iVar1 != 0) goto LAB_00166e00;
          pcVar5 = tinyxml2::XMLElement::GetText(pXVar4);
          std::__cxx11::string::string((string *)&local_280,pcVar5,&local_281);
          local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_190,local_280,local_280 + local_278);
          SVar14 = spectrum_from_string(&local_190);
          light->spectrum = SVar14;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_190._M_dataplus._M_p != &local_190.field_2) {
            operator_delete(local_190._M_dataplus._M_p);
          }
          pcVar5 = tinyxml2::XMLElement::GetText(pXVar6);
          dVar11 = atof(pcVar5);
          light->constant_att = (float)dVar11;
          pcVar5 = tinyxml2::XMLElement::GetText(pXVar7);
          dVar11 = atof(pcVar5);
          light->constant_att = (float)dVar11;
          pcVar5 = tinyxml2::XMLElement::GetText(pXVar8);
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)local_250);
          if (iVar1 != 0) {
LAB_00166e00:
            exit(1);
          }
          light->light_type = SPOT;
          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"color","");
          pXVar4 = get_element(pXVar3,&local_1b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
            operator_delete(local_1b0._M_dataplus._M_p);
          }
          local_258 = tinyxml2::XMLNode::FirstChildElement(&pXVar3->super_XMLNode,"falloff_angle");
          pXVar6 = tinyxml2::XMLNode::FirstChildElement(&pXVar3->super_XMLNode,"falloff_exponent");
          local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1d0,"constant_attenuation","");
          local_260 = get_element(pXVar3,&local_1d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p);
          }
          local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1f0,"linear_attenuation","");
          pXVar7 = get_element(pXVar3,&local_1f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p);
          }
          local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_210,"quadratic_attenuation","");
          pXVar8 = get_element(pXVar3,&local_210);
          pXVar3 = pXVar8;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._M_dataplus._M_p != &local_210.field_2) {
            operator_delete(local_210._M_dataplus._M_p);
            pXVar3 = extraout_RAX;
          }
          auVar12._0_4_ = -(uint)((int)((ulong)pXVar4 >> 0x20) == 0 && (int)pXVar4 == 0);
          auVar12._4_4_ = -(uint)((int)local_258 == 0 && (int)((ulong)local_258 >> 0x20) == 0);
          auVar12._8_4_ = -(uint)((int)((ulong)pXVar6 >> 0x20) == 0 && (int)pXVar6 == 0);
          auVar12._12_4_ = -(uint)((int)local_260 == 0 && (int)((ulong)local_260 >> 0x20) == 0);
          iVar1 = movmskps((int)pXVar3,auVar12);
          if (((iVar1 != 0) || (pXVar7 == (XMLElement *)0x0)) || (pXVar8 == (XMLElement *)0x0))
          goto LAB_00166e00;
          pcVar5 = tinyxml2::XMLElement::GetText(pXVar4);
          std::__cxx11::string::string((string *)&local_280,pcVar5,&local_281);
          local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_230,local_280,local_280 + local_278);
          SVar14 = spectrum_from_string(&local_230);
          light->spectrum = SVar14;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_230._M_dataplus._M_p != &local_230.field_2) {
            operator_delete(local_230._M_dataplus._M_p);
          }
          pcVar5 = tinyxml2::XMLElement::GetText(local_258);
          dVar11 = atof(pcVar5);
          light->constant_att = (float)dVar11;
          pcVar5 = tinyxml2::XMLElement::GetText(pXVar6);
          dVar11 = atof(pcVar5);
          light->constant_att = (float)dVar11;
          pcVar5 = tinyxml2::XMLElement::GetText(local_260);
          dVar11 = atof(pcVar5);
          light->constant_att = (float)dVar11;
          pcVar5 = tinyxml2::XMLElement::GetText(pXVar7);
          dVar11 = atof(pcVar5);
          light->constant_att = (float)dVar11;
          pcVar5 = tinyxml2::XMLElement::GetText(pXVar8);
        }
        dVar11 = atof(pcVar5);
        light->constant_att = (float)dVar11;
        goto LAB_00166dc8;
      }
      light->light_type = AREA;
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"color","");
      pXVar3 = get_element(pXVar3,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      if (pXVar3 == (XMLElement *)0x0) goto LAB_00166e00;
      pcVar5 = tinyxml2::XMLElement::GetText(pXVar3);
      std::__cxx11::string::string((string *)&local_280,pcVar5,&local_281);
      paVar10 = &local_f0.field_2;
      local_f0._M_dataplus._M_p = (pointer)paVar10;
      std::__cxx11::string::_M_construct<char*>((string *)&local_f0,local_280,local_280 + local_278)
      ;
      SVar14 = spectrum_from_string(&local_f0);
      light->spectrum = SVar14;
      _Var9._M_p = local_f0._M_dataplus._M_p;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var9._M_p != paVar10) {
    operator_delete(_Var9._M_p);
  }
LAB_00166dc8:
  if (local_280 != local_270) {
    operator_delete(local_280);
  }
  if (local_250[0] != local_240) {
    operator_delete(local_250[0]);
  }
  return;
}

Assistant:

void ColladaParser::parse_light(XMLElement* xml, LightInfo& light) {
  // name & id
  light.id = xml->Attribute("id");
  light.name = xml->Attribute("name");
  light.type = Instance::LIGHT;

  XMLElement* technique = NULL;
  XMLElement* technique_common = get_technique_common(xml);
  XMLElement* technique_cmu462 = get_technique_cmu462(xml);

  technique = technique_cmu462 ? technique_cmu462 : technique_common;
  if (!technique) {
    stat("Error: No supported profile defined in light: " << light.id);
    exit(EXIT_FAILURE);
  }

  // light parameters
  XMLElement* e_light = technique->FirstChildElement();
  if (e_light) {
    // type
    string type = e_light->Name();

    // type-specific parameters
    if (type == "ambient") {
      light.light_type = LightType::AMBIENT;
      XMLElement* e_color = get_element(e_light, "color");
      if (e_color) {
        string color_string = e_color->GetText();
        light.spectrum = spectrum_from_string(color_string);
      } else {
        stat("Error: No color definition in ambient light: " << light.id);
        exit(EXIT_FAILURE);
      }
    } else if (type == "directional") {
      light.light_type = LightType::DIRECTIONAL;
      XMLElement* e_color = get_element(e_light, "color");
      if (e_color) {
        string color_string = e_color->GetText();
        light.spectrum = spectrum_from_string(color_string);
      } else {
        stat("Error: No color definition in directional light: " << light.id);
        exit(EXIT_FAILURE);
      }
    } else if (type == "area") {
      light.light_type = LightType::AREA;
      XMLElement* e_color = get_element(e_light, "color");
      if (e_color) {
        string color_string = e_color->GetText();
        light.spectrum = spectrum_from_string(color_string);
      } else {
        stat("Error: No color definition in area light: " << light.id);
        exit(EXIT_FAILURE);
      }
    } else if (type == "point") {
      light.light_type = LightType::POINT;
      XMLElement* e_color = get_element(e_light, "color");
      XMLElement* e_constant_att = get_element(e_light, "constant_attenuation");
      XMLElement* e_linear_att = get_element(e_light, "linear_attenuation");
      XMLElement* e_quadratic_att =
          get_element(e_light, "quadratic_attenuation");
      if (e_color && e_constant_att && e_linear_att && e_quadratic_att) {
        string color_string = e_color->GetText();
        light.spectrum = spectrum_from_string(color_string);
        light.constant_att = atof(e_constant_att->GetText());
        light.constant_att = atof(e_linear_att->GetText());
        light.constant_att = atof(e_quadratic_att->GetText());
      } else {
        stat("Error: incomplete definition of point light: " << light.id);
        exit(EXIT_FAILURE);
      }
    } else if (type == "spot") {
      light.light_type = LightType::SPOT;
      XMLElement* e_color = get_element(e_light, "color");
      XMLElement* e_falloff_deg = e_light->FirstChildElement("falloff_angle");
      XMLElement* e_falloff_exp =
          e_light->FirstChildElement("falloff_exponent");
      XMLElement* e_constant_att = get_element(e_light, "constant_attenuation");
      XMLElement* e_linear_att = get_element(e_light, "linear_attenuation");
      XMLElement* e_quadratic_att =
          get_element(e_light, "quadratic_attenuation");
      if (e_color && e_falloff_deg && e_falloff_exp && e_constant_att &&
          e_linear_att && e_quadratic_att) {
        string color_string = e_color->GetText();
        light.spectrum = spectrum_from_string(color_string);
        light.constant_att = atof(e_falloff_deg->GetText());
        light.constant_att = atof(e_falloff_exp->GetText());
        light.constant_att = atof(e_constant_att->GetText());
        light.constant_att = atof(e_linear_att->GetText());
        light.constant_att = atof(e_quadratic_att->GetText());
      } else {
        stat("Error: incomplete definition of spot light: " << light.id);
        exit(EXIT_FAILURE);
      }
    } else {
      stat("Error: Light type " << type << " in light: " << light.id
                                << "is not supported");
      exit(EXIT_FAILURE);
    }
  }

  // print summary
  stat("  |- " << light);
}